

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PyCode.cc
# Opt level: O3

int __thiscall PyCode::generateMFStructPy(PyCode *this,string *cwd)

{
  pointer pcVar1;
  char cVar2;
  undefined8 *puVar3;
  string path;
  ofstream ofs;
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210);
  pcVar1 = (cwd->_M_dataplus)._M_p;
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_230,pcVar1,pcVar1 + cwd->_M_string_length);
  std::__cxx11::string::append((char *)local_230);
  std::ofstream::open((string *)&local_210,(_Ios_Openmode)local_230);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"import json\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"from collections import defaultdict\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"class operateClass():\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,
               "\tagg_func_enum = (\"sum\", \"max\", \"min\", \"count\", \"avg\")\n",0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,
               "\tdef __init__(self, selectAttr : str, havingCond : str, size : int, group_attr, agg_func, select_cond):\n"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.select_attr_agg_func = selectAttr.split(\", \")\n",
               0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.select_attr_parsed = []\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.having_conds = havingCond\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.group_attr = group_attr\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.agg_func = agg_func\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.agg_func_parsed = defaultdict(str)\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.select_conds = select_cond\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.part_size = size\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\tdef parse_agg_group(self):\n",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tfor var_name, func_name in self.agg_func.items():\n",0x34)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,
               "\t\t\tself.agg_func_parsed[var_name] = self.parse_agg_func(func_name)\n",0x43);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t@staticmethod\n",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\tdef parse_agg_func(unparsed_agg_func):\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\t\t\'\'\'\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\t@input: sum_varname\n",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\t@param: unparsed_agg_func : str\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\t@return: {sum(varname) : 0} : dict\n",0x26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\t\t\'\'\'\n",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tparsed_func = []\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tfor item in unparsed_agg_func:\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\tfuc_lst = item.split(\'_\')\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\tif len(fuc_lst) == 3:\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\t\tif fuc_lst[1] in operateClass.agg_func_enum:\n",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,
               "\t\t\t\t\tparsed_func.append(fuc_lst[1] + \'(\' + fuc_lst[2] + \')\')\n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\t\t\t\telse:\n",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,
               "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n"
               ,0x50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\tif len(fuc_lst) == 2:\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\t\tif fuc_lst[0] in operateClass.agg_func_enum:\n",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,
               "\t\t\t\t\tparsed_func.append(fuc_lst[0] + \'(\' + fuc_lst[1] + \')\')\n",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\t\t\t\telse:\n",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,
               "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n"
               ,0x50);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\treturn parsed_func\n",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\tdef parse_select_attr(self):\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tfor item in self.select_attr_agg_func:\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\tif item in self.group_attr:\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\t\tself.select_attr_parsed.append(item)\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\t\t\telse:\n",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\t\t\ttmp = item.split(\"_\")\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,
               "\t\t\t\tself.select_attr_parsed.append(tmp[1] + \"({}.{})\".format(tmp[0], tmp[2]))\n"
               ,0x4e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_210,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"class MFTable():\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\tdef __init__(self, attr_lst : list, agg_lst : list = []):\n"
               ,0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.group_attr = dict.fromkeys(attr_lst, 0)\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_210,"\t\tself.agg_func = defaultdict(int)\n",0x23);
    std::ios::clear((int)(ostream *)&local_210 + (int)*(undefined8 *)(local_210 + -0x18));
    std::ofstream::close();
    if (local_230[0] != local_220) {
      operator_delete(local_230[0]);
    }
    local_210 = _VTT;
    *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
    std::filebuf::~filebuf(local_208);
    std::ios_base::~ios_base(local_118);
    return 0;
  }
  std::ios::clear((int)(string *)&local_210 + (int)*(undefined8 *)(local_210 + -0x18));
  std::ofstream::close();
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_00116d80;
  __cxa_throw(puVar3,&ParserClassException::FileNotOpenException::typeinfo,
              std::exception::~exception);
}

Assistant:

int PyCode::generateMFStructPy(std::string cwd) throw()
{
    std::ofstream ofs;
    std::string path = cwd + "/MFStruct.py";
    ofs.open(path, std::ios::out);
    if (!ofs.is_open())
    {
        ofs.clear();
        ofs.close();
        throw ParserClassException::FileNotOpenException();
    }
    else
    {
        ofs << "import json\n";
        ofs << "from collections import defaultdict\n";
        ofs << "\n";
        ofs << "class operateClass():\n";
        ofs << "\tagg_func_enum = (\"sum\", \"max\", \"min\", \"count\", \"avg\")\n";
        ofs << "\tdef __init__(self, selectAttr : str, havingCond : str, size : int, group_attr, agg_func, select_cond):\n";
        ofs << "\t\tself.select_attr_agg_func = selectAttr.split(\", \")\n";
        ofs << "\t\tself.select_attr_parsed = []\n";
        ofs << "\t\tself.having_conds = havingCond\n";
        ofs << "\t\tself.group_attr = group_attr\n";
        ofs << "\t\tself.agg_func = agg_func\n";
        ofs << "\t\tself.agg_func_parsed = defaultdict(str)\n";
        ofs << "\t\tself.select_conds = select_cond\n";
        ofs << "\t\tself.part_size = size\n";
        ofs << "\n";
        ofs << "\tdef parse_agg_group(self):\n";
        ofs << "\t\tfor var_name, func_name in self.agg_func.items():\n";
        ofs << "\t\t\tself.agg_func_parsed[var_name] = self.parse_agg_func(func_name)\n";
        ofs << "\n";
        ofs << "\t@staticmethod\n";
        ofs << "\tdef parse_agg_func(unparsed_agg_func):\n";
        ofs << "\t\t\'\'\'\n";
        ofs << "\t\t\t@input: sum_varname\n";
        ofs << "\t\t\t@param: unparsed_agg_func : str\n";
        ofs << "\t\t\t@return: {sum(varname) : 0} : dict\n";
        ofs << "\t\t\'\'\'\n";
        ofs << "\t\tparsed_func = []\n";
        ofs << "\t\tfor item in unparsed_agg_func:\n";
        ofs << "\t\t\tfuc_lst = item.split('_')\n";
        ofs << "\t\t\tif len(fuc_lst) == 3:\n";
        ofs << "\t\t\t\tif fuc_lst[1] in operateClass.agg_func_enum:\n";
        ofs << "\t\t\t\t\tparsed_func.append(fuc_lst[1] + \'(\' + fuc_lst[2] + \')\')\n";
        ofs << "\t\t\t\telse:\n";
        ofs << "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n";
        ofs << "\t\t\tif len(fuc_lst) == 2:\n";
        ofs << "\t\t\t\tif fuc_lst[0] in operateClass.agg_func_enum:\n";
        ofs << "\t\t\t\t\tparsed_func.append(fuc_lst[0] + \'(\' + fuc_lst[1] + \')\')\n";
        ofs << "\t\t\t\telse:\n";
        ofs << "\t\t\t\t\traise(TypeError(\"Cannot find this aggregate functions in SQL standards.\"))\n";
        ofs << "\t\treturn parsed_func\n";
        ofs << "\n";
        ofs << "\tdef parse_select_attr(self):\n";
        ofs << "\t\tfor item in self.select_attr_agg_func:\n";
        ofs << "\t\t\tif item in self.group_attr:\n";
        ofs << "\t\t\t\tself.select_attr_parsed.append(item)\n";
        ofs << "\t\t\telse:\n";
        ofs << "\t\t\t\ttmp = item.split(\"_\")\n";
        ofs << "\t\t\t\tself.select_attr_parsed.append(tmp[1] + \"({}.{})\".format(tmp[0], tmp[2]))\n";
        ofs << "\n";
        ofs << "class MFTable():\n";
        ofs << "\tdef __init__(self, attr_lst : list, agg_lst : list = []):\n";
        ofs << "\t\tself.group_attr = dict.fromkeys(attr_lst, 0)\n";
        ofs << "\t\tself.agg_func = defaultdict(int)\n";
        ofs.clear();
        ofs.close();
    }
    return 0;
}